

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int * Ssw_SmlCheckOutput(Ssw_Sml_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int *piVar6;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Ssw_Sml_t *p_local;
  
  pAVar4 = Aig_ManCo(p->pAig,0);
  pAVar5 = Aig_ObjFanin0(pAVar4);
  uVar1 = *(ulong *)&pAVar5->field_0x18;
  uVar2 = Aig_ObjFaninC0(pAVar4);
  if (((uint)(uVar1 >> 3) & 1) != uVar2) {
    __assert_fail("Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x1e8,"int *Ssw_SmlCheckOutput(Ssw_Sml_t *)");
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Vec_PtrSize(p->pAig->vCos);
    if (iVar3 <= local_24) {
      return (int *)0x0;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,local_24);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    iVar3 = Ssw_SmlObjIsConstWord(p,pAVar5);
    if (iVar3 == 0) break;
    local_24 = local_24 + 1;
  }
  piVar6 = Ssw_SmlCheckOutputSavePattern(p,pAVar4);
  return piVar6;
}

Assistant:

int * Ssw_SmlCheckOutput( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
    pObj = Aig_ManCo( p->pAig, 0 );
    assert( Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj) );
    Aig_ManForEachCo( p->pAig, pObj, i )
    {
        if ( !Ssw_SmlObjIsConstWord( p, Aig_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            return Ssw_SmlCheckOutputSavePattern( p, pObj );
        }
    }
    return NULL;
}